

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multidim_static.hpp
# Opt level: O2

int __thiscall
multidim::
MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
::offset(MultiDimNBase<double,_multidim::type_sequence<multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>_>
         *this,initializer_list<int> *L)

{
  int iVar1;
  iterator piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (L->_M_len == 4) {
    piVar2 = L->_M_array;
    iVar5 = 0;
    for (lVar4 = 0; (int)lVar4 != 4; lVar4 = lVar4 + 1) {
      iVar1 = piVar2[lVar4];
      iVar3 = details::
              daccessor<0,_multidim::sspair<5,_336>,_multidim::sspair<6,_56>,_multidim::sspair<7,_8>,_multidim::sspair<8,_1>_>
              ::step((int)lVar4);
      iVar5 = iVar5 + iVar3 * iVar1;
    }
    return iVar5;
  }
  __assert_fail("L.size() == Ncount",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/eruffaldi[P]multidimcxx/multidim_static.hpp"
                ,0x58,
                "int multidim::MultiDimNBase<double, multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>>::offset(const std::initializer_list<int> &) const [T = double, TS = multidim::type_sequence<multidim::sspair<5, 336>, multidim::sspair<6, 56>, multidim::sspair<7, 8>, multidim::sspair<8, 1>>]"
               );
}

Assistant:

int offset(const std::initializer_list<int> & L) const 
		{	
			assert(L.size() == Ncount); //,"wrong number of dims");
			auto x = L.begin(); /// C++14 constexpr
			int o = 0;
			for(int i = 0; i < Ncount; x++, i++)
				o += *x *getstep(i);
			return o;
		}